

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_cfg.cpp
# Opt level: O1

spv_result_t
spvtools::val::ValidateStructuredSelections
          (ValidationState_t *_,
          vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
          *postorder)

{
  uint16_t uVar1;
  BasicBlock *pBVar2;
  Instruction *inst;
  byte bVar3;
  bool bVar4;
  ulong uVar5;
  long lVar6;
  spv_result_t sVar7;
  ulong uVar8;
  size_t index;
  char *pcVar9;
  pointer ppBVar10;
  Instruction *this;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar11;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar12;
  uint true_label;
  uint false_label;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  seen;
  uint local_264;
  spv_result_t local_260;
  uint local_25c;
  ValidationState_t *local_258;
  Instruction *local_250;
  vector<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
  *local_248;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_240;
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  *local_208 [58];
  spv_result_t local_38;
  
  local_240._M_buckets = &local_240._M_single_bucket;
  local_240._M_bucket_count = 1;
  local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_240._M_element_count = 0;
  local_240._M_rehash_policy._M_max_load_factor = 1.0;
  local_240._M_rehash_policy._M_next_resize = 0;
  local_240._M_single_bucket = (__node_base_ptr)0x0;
  ppBVar10 = (postorder->
             super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_258 = _;
  local_248 = postorder;
  if (ppBVar10 !=
      (postorder->
      super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    do {
      pBVar2 = ppBVar10[-1];
      inst = pBVar2->terminator_;
      bVar4 = false;
      if (inst != (Instruction *)0x0) {
        this = inst + -1;
        uVar1 = inst[-1].inst_.opcode;
        if (uVar1 == 0xf6) {
          local_264 = Instruction::GetOperandAs<unsigned_int>(this,0);
          local_208[0] = &local_240;
          local_250 = this;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_208[0],&local_264,local_208);
          local_264 = Instruction::GetOperandAs<unsigned_int>(local_250,1);
          this = local_250;
LAB_001c3dda:
          local_208[0] = &local_240;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_208[0],&local_264,local_208);
        }
        else {
          if (uVar1 == 0xf7) {
            local_264 = Instruction::GetOperandAs<unsigned_int>(this,0);
            goto LAB_001c3dda;
          }
          this = (Instruction *)0x0;
        }
        bVar4 = false;
        if (pBVar2->structurally_reachable_ == true) {
          uVar1 = (inst->inst_).opcode;
          bVar4 = false;
          if (uVar1 == 0xfb) {
            if (this != (Instruction *)0x0) {
              if (0x10 < (ulong)((long)(inst->operands_).
                                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start)) {
                uVar5 = 3;
                index = 1;
                do {
                  uVar8 = uVar5;
                  local_264 = Instruction::GetOperandAs<unsigned_int>(inst,index);
                  local_208[0] = &local_240;
                  std::
                  _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  ::
                  _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                            ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                              *)&local_240,&local_264,local_208);
                  uVar5 = (ulong)((int)uVar8 + 2);
                  index = uVar8;
                } while (uVar8 < (ulong)((long)(inst->operands_).
                                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(inst->operands_).
                                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 4));
              }
              goto LAB_001c3f1c;
            }
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,local_258,SPV_ERROR_INVALID_CFG,inst);
            lVar6 = 0x3c;
            pcVar9 = "OpSwitch must be preceded by an OpSelectionMerge instruction";
LAB_001c3f49:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar9,lVar6);
            local_260 = local_38;
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            bVar4 = true;
          }
          else if (uVar1 == 0xfa) {
            local_264 = Instruction::GetOperandAs<unsigned_int>(inst,1);
            local_25c = Instruction::GetOperandAs<unsigned_int>(inst,2);
            local_208[0] = &local_240;
            pVar11 = std::
                     _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     ::
                     _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                               ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 *)&local_240,&local_264,local_208);
            local_208[0] = &local_240;
            pVar12 = std::
                     _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                     ::
                     _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                               ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                 *)&local_240,&local_25c,local_208);
            if (this == (Instruction *)0x0) {
              bVar3 = pVar11.second & pVar12.second & 1;
            }
            else {
              bVar3 = (this->inst_).opcode == 0xf6 & pVar11.second & pVar12.second;
            }
            if (bVar3 != 0) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,local_258,SPV_ERROR_INVALID_CFG,inst);
              lVar6 = 0x1c;
              pcVar9 = "Selection must be structured";
              goto LAB_001c3f49;
            }
LAB_001c3f1c:
            bVar4 = false;
          }
        }
      }
      sVar7 = local_260;
      if (bVar4) goto LAB_001c3f86;
      ppBVar10 = ppBVar10 + -1;
    } while (ppBVar10 !=
             (local_248->
             super__Vector_base<const_spvtools::val::BasicBlock_*,_std::allocator<const_spvtools::val::BasicBlock_*>_>
             )._M_impl.super__Vector_impl_data._M_start);
  }
  sVar7 = SPV_SUCCESS;
LAB_001c3f86:
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_240);
  return sVar7;
}

Assistant:

spv_result_t ValidateStructuredSelections(
    ValidationState_t& _, const std::vector<const BasicBlock*>& postorder) {
  std::unordered_set<uint32_t> seen;
  for (auto iter = postorder.rbegin(); iter != postorder.rend(); ++iter) {
    const auto* block = *iter;
    const auto* terminator = block->terminator();
    if (!terminator) continue;
    const auto index = terminator - &_.ordered_instructions()[0];
    auto* merge = &_.ordered_instructions()[index - 1];
    // Marks merges and continues as seen.
    if (merge->opcode() == spv::Op::OpSelectionMerge) {
      seen.insert(merge->GetOperandAs<uint32_t>(0));
    } else if (merge->opcode() == spv::Op::OpLoopMerge) {
      seen.insert(merge->GetOperandAs<uint32_t>(0));
      seen.insert(merge->GetOperandAs<uint32_t>(1));
    } else {
      // Only track the pointer if it is a merge instruction.
      merge = nullptr;
    }

    // Skip unreachable blocks.
    if (!block->structurally_reachable()) continue;

    if (terminator->opcode() == spv::Op::OpBranchConditional) {
      const auto true_label = terminator->GetOperandAs<uint32_t>(1);
      const auto false_label = terminator->GetOperandAs<uint32_t>(2);
      // Mark the upcoming blocks as seen now, but only error out if this block
      // was missing a merge instruction and both labels hadn't been seen
      // previously.
      const bool true_label_unseen = seen.insert(true_label).second;
      const bool false_label_unseen = seen.insert(false_label).second;
      if ((!merge || merge->opcode() == spv::Op::OpLoopMerge) &&
          true_label_unseen && false_label_unseen) {
        return _.diag(SPV_ERROR_INVALID_CFG, terminator)
               << "Selection must be structured";
      }
    } else if (terminator->opcode() == spv::Op::OpSwitch) {
      if (!merge) {
        return _.diag(SPV_ERROR_INVALID_CFG, terminator)
               << "OpSwitch must be preceded by an OpSelectionMerge "
                  "instruction";
      }
      // Mark the targets as seen.
      for (uint32_t i = 1; i < terminator->operands().size(); i += 2) {
        const auto target = terminator->GetOperandAs<uint32_t>(i);
        seen.insert(target);
      }
    }
  }

  return SPV_SUCCESS;
}